

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::asFile
          (InMemoryDirectory *this,Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,
          EntryImpl *entry,WriteMode mode)

{
  int iVar1;
  Mutex *this_00;
  undefined8 *puVar2;
  undefined8 *puVar3;
  size_t sVar4;
  long *plVar5;
  undefined8 uVar6;
  undefined4 in_register_0000000c;
  long lVar7;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *extraout_RDX_02;
  File *extraout_RDX_03;
  File *extraout_RDX_04;
  File *extraout_RDX_05;
  byte in_R8B;
  _func_int **pp_Var9;
  String *pSVar10;
  Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> MVar11;
  PathPtr path;
  Path newPath;
  DebugExpression<bool> _kjCondition;
  Path local_58;
  DebugExpression<bool> local_40;
  undefined7 uStack_3f;
  long *local_38;
  File *pFVar8;
  
  lVar7 = CONCAT44(in_register_0000000c,mode);
  iVar1 = *(int *)(lVar7 + 0x18);
  if (iVar1 == 0) {
    local_40.value = (bool)(in_R8B & 1);
    if ((in_R8B & 1) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x6b6,FAILED,"has(mode, WriteMode::CREATE)","_kjCondition,",&local_40);
      kj::_::Debug::Fault::fatal((Fault *)&local_58);
    }
    puVar2 = (undefined8 *)(entry->name).content.size_;
    uVar6 = (*(code *)**(undefined8 **)*puVar2)();
    puVar2[8] = uVar6;
    puVar2 = (undefined8 *)(entry->name).content.size_;
    puVar3 = (undefined8 *)puVar2[1];
    (**(code **)*puVar3)(&local_40,puVar3,*puVar2);
    if (((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          *)(lVar7 + 0x18))->tag != 0) {
      OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
      ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                 *)(lVar7 + 0x18));
    }
    plVar5 = local_38;
    *(ulong *)(lVar7 + 0x20) = CONCAT71(uStack_3f,local_40.value);
    *(long **)(lVar7 + 0x28) = local_38;
    local_38 = (long *)0x0;
    *(undefined4 *)(lVar7 + 0x18) = 1;
    (**(code **)(*plVar5 + 0x28))(&local_58);
    pp_Var9 = (_func_int **)local_58.parts.size_;
    if ((_func_int **)local_58.parts.size_ == (_func_int **)0x0) {
      pSVar10 = (String *)0x0;
      pp_Var9 = (_func_int **)0x0;
    }
    else {
      local_58.parts.size_ = 0;
      pSVar10 = local_58.parts.ptr;
    }
    sVar4 = local_58.parts.size_;
    pFVar8 = extraout_RDX_01;
    if ((_func_int **)local_58.parts.size_ != (_func_int **)0x0) {
      local_58.parts.size_ = 0;
      (**(code **)((local_58.parts.ptr)->content).ptr)
                (local_58.parts.ptr,sVar4 + *(long *)(*(_func_int **)sVar4 + -0x10));
      pFVar8 = extraout_RDX_04;
    }
    plVar5 = local_38;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)pSVar10;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var9;
    if (local_38 != (long *)0x0) {
      local_38 = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT71(uStack_3f,local_40.value))
                ((undefined8 *)CONCAT71(uStack_3f,local_40.value),
                 (long)plVar5 + *(long *)(*plVar5 + -0x10));
      pFVar8 = extraout_RDX_05;
    }
  }
  else if (iVar1 == 3) {
    SymlinkNode::parse(&local_58,(SymlinkNode *)(lVar7 + 0x20));
    this_00 = (Mutex *)(entry->name).content.ptr;
    if (this_00 != (Mutex *)0x0) {
      kj::_::Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
    }
    (entry->name).content.ptr = (char *)0x0;
    (entry->name).content.size_ = 0;
    path.parts.size_ = (size_t)local_58.parts.ptr;
    path.parts.ptr = (String *)lock;
    MVar11 = tryOpenFile(this,path,(WriteMode)local_58.parts.size_);
    sVar4 = local_58.parts.size_;
    pSVar10 = local_58.parts.ptr;
    pFVar8 = MVar11.ptr.ptr;
    if (local_58.parts.ptr != (String *)0x0) {
      local_58.parts.ptr = (String *)0x0;
      local_58.parts.size_ = 0;
      (**(local_58.parts.disposer)->_vptr_ArrayDisposer)
                (local_58.parts.disposer,pSVar10,0x18,sVar4,sVar4,
                 ArrayDisposer::Dispose_<kj::String>::destruct);
      pFVar8 = extraout_RDX_00;
    }
  }
  else if (iVar1 == 1) {
    (**(code **)(**(long **)(lVar7 + 0x28) + 0x28))(&local_58);
    pp_Var9 = (_func_int **)local_58.parts.size_;
    if ((_func_int **)local_58.parts.size_ == (_func_int **)0x0) {
      pp_Var9 = (_func_int **)0x0;
      pSVar10 = (String *)0x0;
    }
    else {
      local_58.parts.size_ = 0;
      pSVar10 = local_58.parts.ptr;
    }
    sVar4 = local_58.parts.size_;
    pFVar8 = extraout_RDX;
    if ((_func_int **)local_58.parts.size_ != (_func_int **)0x0) {
      local_58.parts.size_ = 0;
      (**(code **)((local_58.parts.ptr)->content).ptr)
                (local_58.parts.ptr,sVar4 + *(long *)(*(_func_int **)sVar4 + -0x10));
      pFVar8 = extraout_RDX_03;
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)pSVar10;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var9;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x6ba,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)&local_58);
    pFVar8 = extraout_RDX_02;
  }
  MVar11.ptr.ptr = pFVar8;
  MVar11.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>)MVar11.ptr;
}

Assistant:

Maybe<Own<const File>> asFile(kj::Locked<Impl>& lock, EntryImpl& entry, WriteMode mode) const {
    if (entry.node.is<FileNode>()) {
      return entry.node.get<FileNode>().file->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      // CREATE_PARENT doesn't apply to creating the parents of a symlink target. However, the
      // target itself can still be created.
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenFile(newPath, mode - WriteMode::CREATE_PARENT);
    } else if (entry.node == nullptr) {
      KJ_ASSERT(has(mode, WriteMode::CREATE));
      lock->modified();
      return entry.init(FileNode { lock->newFile() });
    } else {
      KJ_FAIL_REQUIRE("not a file") { return kj::none; }
    }
  }